

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxleastsqsc.hpp
# Opt level: O0

void soplex::
     initConstVecs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
               (SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *vecset,SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *facset,
               SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *veclogs,SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *vecnnzinv,
               number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *epsilon)

{
  bool bVar1;
  cpp_dec_float<200U,_int,_void> *pcVar2;
  undefined8 in_RCX;
  int __c;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_RDX;
  double __x;
  int i_1;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *vecnew;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  nnzinv;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  a;
  int i;
  int size;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *lpvec;
  int nnz;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  logsum;
  int k;
  int nvec;
  undefined4 in_stack_fffffffffffff8d8;
  int in_stack_fffffffffffff8dc;
  cpp_dec_float<200U,_int,_void> *in_stack_fffffffffffff8e0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff8e8;
  undefined4 in_stack_fffffffffffff8f0;
  int in_stack_fffffffffffff8f4;
  undefined8 uVar3;
  undefined4 in_stack_fffffffffffff900;
  int iVar4;
  undefined1 local_6ec [124];
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff990;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff9d8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff9e0;
  double in_stack_fffffffffffff9f0;
  cpp_dec_float<200U,_int,_void> *in_stack_fffffffffffff9f8;
  uint local_5ec;
  undefined1 local_5e0 [128];
  undefined1 local_560 [128];
  undefined8 local_4e0;
  undefined8 local_4d8;
  double local_4d0;
  undefined1 local_4c8 [128];
  undefined1 local_448 [256];
  double local_348;
  undefined1 local_340 [128];
  undefined1 local_2c0 [128];
  undefined1 local_240 [128];
  int local_1c0;
  int local_1bc;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_1b8;
  int local_1ac;
  undefined8 local_1a8;
  undefined1 local_1a0 [128];
  int local_120;
  int local_11c;
  undefined8 local_110;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_108;
  undefined8 local_f0;
  undefined8 *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_d0;
  undefined1 *local_c8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  undefined1 *local_a8;
  undefined1 *local_a0;
  undefined1 *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_70;
  undefined1 *local_68;
  undefined1 *local_58;
  undefined8 *local_50;
  undefined8 *local_48;
  undefined1 *local_40;
  undefined8 *local_38;
  undefined8 *local_30;
  undefined1 *local_28;
  undefined8 *local_20;
  double *local_18;
  undefined1 *local_10;
  double *local_8;
  
  local_110 = in_RCX;
  local_108 = in_RDX;
  local_11c = SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::num((SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)0x171c41);
  for (local_120 = 0; local_120 < local_11c; local_120 = local_120 + 1) {
    local_1a8 = 0;
    local_e0 = local_1a0;
    local_e8 = &local_1a8;
    local_f0 = 0;
    local_50 = local_e8;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              ((cpp_dec_float<200U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
               (double)in_stack_fffffffffffff8e8,in_stack_fffffffffffff8e0);
    local_1ac = 0;
    local_1b8 = SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::operator[]((SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)in_stack_fffffffffffff8e0,in_stack_fffffffffffff8dc);
    local_1bc = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::size(local_1b8);
    for (local_1c0 = 0; local_1c0 < local_1bc; local_1c0 = local_1c0 + 1) {
      local_d0 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::value(local_1b8,local_1c0);
      local_c8 = local_240;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                (in_stack_fffffffffffff8e0,
                 (cpp_dec_float<200U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8));
      local_b8 = local_2c0;
      local_c0 = local_240;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                (in_stack_fffffffffffff8e0,
                 (cpp_dec_float<200U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8));
      local_a8 = local_340;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                (in_stack_fffffffffffff8e0,
                 (cpp_dec_float<200U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8));
      bVar1 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8);
      if (!bVar1) {
        local_98 = local_448;
        local_a0 = local_240;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                  (in_stack_fffffffffffff8e0,
                   (cpp_dec_float<200U,_int,_void> *)
                   CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8));
        spxAbs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8));
        __x = boost::multiprecision::number::operator_cast_to_double
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x171e42);
        local_348 = log2(__x);
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
        ::operator+=(in_stack_fffffffffffff8e8,(double *)in_stack_fffffffffffff8e0);
        local_1ac = local_1ac + 1;
      }
    }
    local_d8 = local_4c8;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              (in_stack_fffffffffffff8e0);
    if (local_1ac < 1) {
      local_4d8 = 0x3ff0000000000000;
      local_28 = local_1a0;
      local_30 = &local_4d8;
      local_20 = local_30;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                (in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0);
      local_4e0 = 0x3ff0000000000000;
      local_40 = local_4c8;
      local_48 = &local_4e0;
      local_38 = local_48;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                (in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0);
    }
    else {
      local_4d0 = 1.0 / (double)local_1ac;
      local_10 = local_4c8;
      local_18 = &local_4d0;
      local_8 = local_18;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                (in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0);
    }
    local_88 = local_560;
    local_90 = local_1a0;
    in_stack_fffffffffffff8e8 = local_108;
    in_stack_fffffffffffff8f4 = local_120;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              (in_stack_fffffffffffff8e0,
               (cpp_dec_float<200U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8));
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::add((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
          (int)((ulong)in_stack_fffffffffffff8e8 >> 0x20),
          (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *)in_stack_fffffffffffff8e0);
    local_78 = local_5e0;
    local_80 = local_4c8;
    uVar3 = local_110;
    iVar4 = local_120;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              (in_stack_fffffffffffff8e0,
               (cpp_dec_float<200U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8));
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::add((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
          (int)((ulong)in_stack_fffffffffffff8e8 >> 0x20),
          (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *)in_stack_fffffffffffff8e0);
    pcVar2 = (cpp_dec_float<200U,_int,_void> *)
             SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::create((SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)CONCAT44(iVar4,in_stack_fffffffffffff900),(int)((ulong)uVar3 >> 0x20));
    for (local_5ec = 0; (int)local_5ec < local_1bc; local_5ec = local_5ec + 1) {
      local_70 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::value(local_1b8,local_5ec);
      local_68 = &stack0xfffffffffffff994;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                (in_stack_fffffffffffff8e0,
                 (cpp_dec_float<200U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8));
      local_58 = local_6ec;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                (in_stack_fffffffffffff8e0,
                 (cpp_dec_float<200U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8));
      bVar1 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8);
      if (!bVar1) {
        in_stack_fffffffffffff8e0 = pcVar2;
        SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::index(local_1b8,(char *)(ulong)local_5ec,__c);
        SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::add((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)CONCAT44(iVar4,in_stack_fffffffffffff900),(int)((ulong)uVar3 >> 0x20),
              (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0));
      }
    }
    SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::sort(in_stack_fffffffffffff990);
  }
  return;
}

Assistant:

static void initConstVecs(
   const SVSetBase<R>* vecset,
   SVSetBase<R>& facset,
   SSVectorBase<R>& veclogs,
   SSVectorBase<R>& vecnnzinv,
   R epsilon)
{
   assert(vecset != nullptr);

   const int nvec = vecset->num();

   for(int k = 0; k < nvec; ++k)
   {
      R logsum = 0.0;
      int nnz = 0;
      // get kth row or column of LP
      const SVectorBase<R>& lpvec = (*vecset)[k];
      const int size = lpvec.size();

      for(int i = 0; i < size; ++i)
      {
         const R a = lpvec.value(i);

         if(!isZero(a, epsilon))
         {
            logsum += log2(double(spxAbs(a))); // todo spxLog2?
            nnz++;
         }
      }

      R nnzinv;

      if(nnz > 0)
      {
         nnzinv = 1.0 / nnz;
      }
      else
      {
         /* all-0 entries */
         logsum = 1.0;
         nnzinv = 1.0;
      }

      veclogs.add(k, logsum);
      vecnnzinv.add(k, nnzinv);

      /* create new VectorBase<R> for facset */
      SVectorBase<R>& vecnew = (*(facset.create(nnz)));

      for(int i = 0; i < size; ++i)
      {
         if(!isZero(lpvec.value(i), epsilon))
            vecnew.add(lpvec.index(i), nnzinv);
      }

      vecnew.sort();
   }

   assert(veclogs.isSetup());
   assert(vecnnzinv.isSetup());
}